

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

bool __thiscall Assembler::checkIfWord(Assembler *this,string *line)

{
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  WordSectionError *this_01;
  string local_298;
  string local_278;
  string local_258;
  undefined1 local_238 [8];
  string substr;
  stringstream ss;
  string_type local_90;
  string local_60 [8];
  string data;
  smatch word;
  string *line_local;
  Assembler *this_local;
  
  this_00 = (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&data.field_2 + 8);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results(this_00);
  std::__cxx11::string::string(local_60);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,this_00,&wordDirectiveReg_abi_cxx11_,0);
  if (bVar1) {
    bVar1 = std::operator==(&currentSectionName_abi_cxx11_,"");
    if (bVar1) {
      this_01 = (WordSectionError *)__cxa_allocate_exception(8);
      *this_01 = (WordSectionError)0x0;
      WordSectionError::WordSectionError(this_01);
      __cxa_throw(this_01,&WordSectionError::typeinfo,WordSectionError::~WordSectionError);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_90,
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)((long)&data.field_2 + 8),1);
    std::__cxx11::string::operator=(local_60,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(substr.field_2._M_local_buf + 8),local_60,_Var3);
    while( true ) {
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) break;
      std::__cxx11::string::string((string *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)(substr.field_2._M_local_buf + 8),(string *)local_238,',');
      removeSpaces(&local_258,this,(string *)local_238);
      std::__cxx11::string::operator=((string *)local_238,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      if ((first & 1U) == 0) {
        std::__cxx11::string::string((string *)&local_298,(string *)local_238);
        processWordSecondPass(this,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
      }
      else {
        std::__cxx11::string::string((string *)&local_278,(string *)local_238);
        processWordFirstPass(this,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
      }
      std::__cxx11::string::~string((string *)local_238);
    }
    this_local._7_1_ = true;
    std::__cxx11::stringstream::~stringstream((stringstream *)(substr.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)((long)&data.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool Assembler::checkIfWord(string line) {
    smatch word;
    string data;
    if (regex_match(line, word, wordDirectiveReg)) {
        if (currentSectionName == "") throw WordSectionError();
        data = word.str(1);
        stringstream ss(data);
        while (ss.good()) {
            string substr;
            getline(ss, substr, ',');
            substr = removeSpaces(substr);
            if (first) processWordFirstPass(substr);
            else processWordSecondPass(substr);
        }
        return true;
    }


    return false;
}